

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.hpp
# Opt level: O3

void duckdb::PreparedStatement::VerifyParameters<duckdb::BoundParameterData>
               (case_insensitive_map_t<duckdb::BoundParameterData> *provided,
               case_insensitive_map_t<idx_t> *expected)

{
  ulong uVar1;
  ulong uVar2;
  const_iterator cVar3;
  InvalidInputException *pIVar4;
  __node_base *p_Var5;
  case_insensitive_map_t<idx_t> *__range3;
  string local_50;
  
  uVar1 = (expected->_M_h)._M_element_count;
  uVar2 = (provided->_M_h)._M_element_count;
  if (uVar1 != uVar2) {
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    if (uVar2 < uVar1) {
      MissingValuesException<duckdb::BoundParameterData>(&local_50,expected,provided);
      InvalidInputException::InvalidInputException(pIVar4,(string *)&local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ExcessValuesException<duckdb::BoundParameterData>(&local_50,expected,provided);
    InvalidInputException::InvalidInputException(pIVar4,(string *)&local_50);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var5 = &(expected->_M_h)._M_before_begin;
  do {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) {
      return;
    }
    cVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&provided->_M_h,(key_type *)(p_Var5 + 1));
  } while (cVar3.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
           ._M_cur != (__node_type *)0x0);
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  MissingValuesException<duckdb::BoundParameterData>(&local_50,expected,provided);
  InvalidInputException::InvalidInputException(pIVar4,(string *)&local_50);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyParameters(const case_insensitive_map_t<PAYLOAD> &provided,
	                             const case_insensitive_map_t<idx_t> &expected) {
		if (expected.size() == provided.size()) {
			// Same amount of identifiers, if
			for (auto &pair : expected) {
				auto &identifier = pair.first;
				if (!provided.count(identifier)) {
					throw InvalidInputException(MissingValuesException(expected, provided));
				}
			}
			return;
		}
		// Mismatch in expected and provided parameters/values
		if (expected.size() > provided.size()) {
			throw InvalidInputException(MissingValuesException(expected, provided));
		} else {
			D_ASSERT(provided.size() > expected.size());
			throw InvalidInputException(ExcessValuesException(expected, provided));
		}
	}